

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

void qlist_donext(t_qlist *x,int drop,int automatic)

{
  t_atomtype tVar1;
  t_atomtype *ptVar2;
  int iVar3;
  int iVar4;
  t_atom *ptVar5;
  t_atom *argv;
  int iVar6;
  int iVar7;
  t_symbol *s;
  _class **x_00;
  float fVar8;
  double dVar9;
  
  if (x->x_innext != 0) {
    pd_error(x,"qlist sent \'next\' from within itself");
    return;
  }
  x->x_innext = 1;
LAB_001870e8:
  x_00 = (_class **)0x0;
LAB_001870eb:
  iVar4 = binbuf_getnatom((x->x_textbuf).b_binbuf);
  iVar7 = x->x_onset;
  ptVar5 = binbuf_getvec((x->x_textbuf).b_binbuf);
  if (iVar4 <= iVar7) {
LAB_0018721f:
    x->x_onset = 0x7fffffff;
    x->x_whenclockset = 0.0;
    x->x_innext = 0;
    outlet_bang(x->x_bangout);
    return;
  }
  argv = ptVar5 + iVar7;
  ptVar5 = ptVar5 + iVar7;
  while( true ) {
    ptVar5 = ptVar5 + 1;
    tVar1 = argv->a_type;
    if ((tVar1 & ~A_FLOAT) != A_SEMI) break;
    if (tVar1 == A_SEMI) {
      x_00 = (_class **)0x0;
    }
    iVar7 = iVar7 + 1;
    argv = argv + 1;
    if (iVar4 <= iVar7) goto LAB_0018721f;
  }
  if (tVar1 != A_FLOAT || x_00 != (_class **)0x0) {
    ptVar5 = argv + 1;
    iVar3 = 1;
    do {
      iVar6 = iVar3;
      if (iVar4 <= iVar6 + iVar7) break;
      ptVar2 = &ptVar5->a_type;
      ptVar5 = ptVar5 + 1;
      iVar3 = iVar6 + 1;
    } while (*ptVar2 - A_FLOAT < 2);
    x->x_onset = iVar6 + iVar7;
    if (x_00 == (_class **)0x0) goto LAB_001871b6;
    goto LAB_00187192;
  }
  iVar3 = 1;
  goto LAB_0018724c;
LAB_001871b6:
  x_00 = (_class **)0x0;
  if (tVar1 != A_SYMBOL) goto LAB_001870eb;
  x_00 = ((argv->a_w).w_symbol)->s_thing;
  if (x_00 == (_class **)0x0) goto LAB_00187206;
  if (iVar6 == 1) goto LAB_001870eb;
  iVar6 = iVar6 + -1;
  argv = argv + 1;
LAB_00187192:
  iVar7 = x->x_rewound;
  x->x_rewound = 0;
  if (drop == 0) {
    if (argv->a_type == A_SYMBOL) {
      s = (argv->a_w).w_symbol;
      iVar6 = iVar6 + -1;
      argv = argv + 1;
    }
    else {
      if (argv->a_type != A_FLOAT) goto LAB_001871fe;
      s = &s_list;
    }
    pd_typedmess(x_00,s,iVar6,argv);
    if (x->x_rewound != 0) goto LAB_0018729f;
  }
LAB_001871fe:
  x->x_rewound = iVar7;
  goto LAB_001870eb;
LAB_00187206:
  pd_error(x,"qlist: %s: no such object",((argv->a_w).w_symbol)->s_name);
  goto LAB_001870e8;
  while( true ) {
    ptVar2 = &ptVar5->a_type;
    ptVar5 = ptVar5 + 1;
    iVar3 = iVar6 + 1;
    if (*ptVar2 != A_FLOAT) break;
LAB_0018724c:
    iVar6 = iVar3;
    if (iVar4 <= iVar6 + iVar7) break;
  }
  x->x_onset = iVar6 + iVar7;
  if (automatic == 0) {
    outlet_list((x->x_textbuf).b_ob.te_outlet,(t_symbol *)0x0,iVar6,argv);
  }
  else {
    fVar8 = (argv->a_w).w_float * x->x_tempo;
    x->x_clockdelay = fVar8;
    clock_delay(x->x_clock,(double)fVar8);
    dVar9 = clock_getsystime();
    x->x_whenclockset = dVar9;
  }
LAB_0018729f:
  x->x_innext = 0;
  return;
}

Assistant:

static void qlist_donext(t_qlist *x, int drop, int automatic)
{
    t_pd *target = 0;
    if (x->x_innext)
    {
        pd_error(x, "qlist sent 'next' from within itself");
        return;
    }
    x->x_innext = 1;
    while (1)
    {
        int argc = binbuf_getnatom(x->x_binbuf),
            count, onset = x->x_onset, onset2, wasrewound;
        t_atom *argv = binbuf_getvec(x->x_binbuf);
        t_atom *ap = argv + onset, *ap2;
        if (onset >= argc) goto end;
        while (ap->a_type == A_SEMI || ap->a_type == A_COMMA)
        {
            if (ap->a_type == A_SEMI) target = 0;
            onset++, ap++;
            if (onset >= argc) goto end;
        }

        if (!target && ap->a_type == A_FLOAT)
        {
            ap2 = ap + 1;
            onset2 = onset + 1;
            while (onset2 < argc && ap2->a_type == A_FLOAT)
                onset2++, ap2++;
            x->x_onset = onset2;
            if (automatic)
            {
                clock_delay(x->x_clock,
                    x->x_clockdelay = ap->a_w.w_float * x->x_tempo);
                x->x_whenclockset = clock_getsystime();
            }
            else outlet_list(x->x_ob.ob_outlet, 0, onset2-onset, ap);
            x->x_innext = 0;
            return;
        }
        ap2 = ap + 1;
        onset2 = onset + 1;
        while (onset2 < argc &&
            (ap2->a_type == A_FLOAT || ap2->a_type == A_SYMBOL))
                onset2++, ap2++;
        x->x_onset = onset2;
        count = onset2 - onset;
        if (!target)
        {
            if (ap->a_type != A_SYMBOL) continue;
            else if (!(target = ap->a_w.w_symbol->s_thing))
            {
                pd_error(x, "qlist: %s: no such object",
                    ap->a_w.w_symbol->s_name);
                continue;
            }
            ap++;
            onset++;
            count--;
            if (!count)
            {
                x->x_onset = onset2;
                continue;
            }
        }
        wasrewound = x->x_rewound;
        x->x_rewound = 0;
        if (!drop)
        {
            if (ap->a_type == A_FLOAT)
                typedmess(target, &s_list, count, ap);
            else if (ap->a_type == A_SYMBOL)
                typedmess(target, ap->a_w.w_symbol, count-1, ap+1);
        }
        if (x->x_rewound)
        {
            x->x_innext = 0;
            return;
        }
        x->x_rewound = wasrewound;
    }  /* while (1); never falls through */

end:
    x->x_onset = 0x7fffffff;
    x->x_whenclockset = 0;
    x->x_innext = 0;
    outlet_bang(x->x_bangout);
}